

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O0

void __thiscall MetaSim::BaseStat::print(BaseStat *this)

{
  ostream *poVar1;
  double dVar2;
  BaseStat *in_stack_000000d0;
  CONFIDENCE_INTERVAL in_stack_0000015c;
  BaseStat *in_stack_00000160;
  BaseStat *in_stack_ffffffffffffff68;
  string local_28 [40];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[");
  getName_abi_cxx11_(in_stack_ffffffffffffff68);
  poVar1 = std::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"]:");
  dVar2 = getMean(in_stack_000000d0);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1,"  (Conf[95%]=");
  dVar2 = getConfInterval(in_stack_00000160,in_stack_0000015c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void BaseStat::print()
    {
        cout << "[" << getName()
             << "]:" << getMean()
             << "  (Conf[95%]=" << getConfInterval(BaseStat::C95)
             << ")" 
             << endl;
    }